

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_utils.cpp
# Opt level: O0

void __thiscall icu_63::number::impl::DecNum::DecNum(DecNum *this,DecNum *other,UErrorCode *status)

{
  int32_t iVar1;
  rounding rVar2;
  uint32_t uVar3;
  undefined3 uVar4;
  uint8_t uVar5;
  undefined2 uVar6;
  decNumber *pdVar7;
  decNumber *pdVar8;
  char *__dest;
  char *__src;
  char *pcVar9;
  char *pcVar10;
  void *p;
  UErrorCode *status_local;
  DecNum *other_local;
  DecNum *this_local;
  
  MaybeStackHeaderAndArray<decNumber,_char,_34>::MaybeStackHeaderAndArray(&this->fData);
  iVar1 = (other->fContext).emax;
  (this->fContext).digits = (other->fContext).digits;
  (this->fContext).emax = iVar1;
  rVar2 = (other->fContext).round;
  (this->fContext).emin = (other->fContext).emin;
  (this->fContext).round = rVar2;
  uVar3 = (other->fContext).status;
  (this->fContext).traps = (other->fContext).traps;
  (this->fContext).status = uVar3;
  uVar4 = *(undefined3 *)&(other->fContext).field_0x19;
  (this->fContext).clamp = (other->fContext).clamp;
  *(undefined3 *)&(this->fContext).field_0x19 = uVar4;
  if (((this->fContext).digits < 0x23) ||
     (pdVar7 = MaybeStackHeaderAndArray<decNumber,_char,_34>::resize
                         (&this->fData,(this->fContext).digits,0), pdVar7 != (decNumber *)0x0)) {
    pdVar7 = MaybeStackHeaderAndArray<decNumber,_char,_34>::getAlias(&this->fData);
    pdVar8 = MaybeStackHeaderAndArray<decNumber,_char,_34>::getAlias(&other->fData);
    uVar5 = pdVar8->lsu[0];
    uVar6 = *(undefined2 *)&pdVar8->field_0xa;
    pdVar7->bits = pdVar8->bits;
    pdVar7->lsu[0] = uVar5;
    *(undefined2 *)&pdVar7->field_0xa = uVar6;
    iVar1 = pdVar8->exponent;
    pdVar7->digits = pdVar8->digits;
    pdVar7->exponent = iVar1;
    __dest = MaybeStackHeaderAndArray<decNumber,_char,_34>::getArrayStart(&this->fData);
    __src = MaybeStackHeaderAndArray<decNumber,_char,_34>::getArrayStart(&other->fData);
    pcVar9 = MaybeStackHeaderAndArray<decNumber,_char,_34>::getArrayLimit(&other->fData);
    pcVar10 = MaybeStackHeaderAndArray<decNumber,_char,_34>::getArrayStart(&other->fData);
    memcpy(__dest,__src,(long)pcVar9 - (long)pcVar10);
  }
  else {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  return;
}

Assistant:

DecNum::DecNum(const DecNum& other, UErrorCode& status)
        : fContext(other.fContext) {
    // Allocate memory for the new DecNum.
    U_ASSERT(fContext.digits == other.fData.getCapacity());
    if (fContext.digits > kDefaultDigits) {
        void* p = fData.resize(fContext.digits, 0);
        if (p == nullptr) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
    }

    // Copy the data from the old DecNum to the new one.
    uprv_memcpy(fData.getAlias(), other.fData.getAlias(), sizeof(decNumber));
    uprv_memcpy(fData.getArrayStart(),
            other.fData.getArrayStart(),
            other.fData.getArrayLimit() - other.fData.getArrayStart());
}